

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogUnixServer.cpp
# Opt level: O0

void __thiscall liblogger::LogUnixServer::LogUnixServer(LogUnixServer *this,string *path)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  int *piVar4;
  undefined8 uVar5;
  LogException *this_00;
  string *message;
  string *in_RSI;
  ILogger *in_RDI;
  exception *ex;
  stringstream ss_4;
  stringstream ss_3;
  stringstream ss_2;
  socklen_t sockaddr_len;
  sockaddr_un serv_addr;
  stringstream ss_1;
  stringstream ss;
  string *in_stack_fffffffffffff668;
  LogException *in_stack_fffffffffffff670;
  stringstream local_8d8 [16];
  ostream local_8c8 [383];
  undefined1 local_749;
  stringstream local_728 [16];
  ostream local_718 [383];
  undefined1 local_599;
  stringstream local_578 [16];
  ostream local_568 [380];
  socklen_t local_3ec;
  sockaddr local_3e8 [6];
  undefined1 local_379;
  stringstream local_358 [16];
  ostream local_348 [383];
  undefined1 local_1c9;
  stringstream local_1a8 [16];
  ostream local_198 [392];
  string *local_10;
  
  local_10 = in_RSI;
  ILogger::ILogger(in_RDI);
  in_RDI->_vptr_ILogger = (_func_int **)&PTR__LogUnixServer_001cc9c8;
  std::__cxx11::list<int,_std::allocator<int>_>::list((list<int,_std::allocator<int>_> *)0x1aeed3);
  std::__cxx11::string::string((string *)(in_RDI + 10),local_10);
  *(undefined4 *)&in_RDI[0xe]._vptr_ILogger = 0xffffffff;
  *(undefined1 *)((long)&in_RDI[0xf]._vptr_ILogger + 4) = 0;
  *(undefined4 *)((long)&in_RDI[0xe]._vptr_ILogger + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[0xf]._vptr_ILogger = 0xffffffff;
  iVar1 = pthread_mutex_init((pthread_mutex_t *)(in_RDI + 2),(pthread_mutexattr_t *)0x0);
  if (iVar1 != 0) {
    abort();
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  unlink(pcVar2);
  iVar1 = socket(1,1,0);
  *(int *)&in_RDI[0xe]._vptr_ILogger = iVar1;
  if (*(int *)&in_RDI[0xe]._vptr_ILogger < 0) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar3 = std::operator<<(local_198,"Cannot create socket: ");
    piVar4 = __errno_location();
    pcVar2 = strerror(*piVar4);
    std::operator<<(poVar3,pcVar2);
    local_1c9 = 1;
    uVar5 = __cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    LogException::LogException(in_stack_fffffffffffff670,in_stack_fffffffffffff668);
    local_1c9 = 0;
    __cxa_throw(uVar5,&LogException::typeinfo,LogException::~LogException);
  }
  iVar1 = socketpair(1,1,0,(int *)((long)&in_RDI[0xe]._vptr_ILogger + 4));
  if (iVar1 != 0) {
    std::__cxx11::stringstream::stringstream(local_358);
    poVar3 = std::operator<<(local_348,"Cannot create ctlfd: ");
    piVar4 = __errno_location();
    pcVar2 = strerror(*piVar4);
    std::operator<<(poVar3,pcVar2);
    local_379 = 1;
    uVar5 = __cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    LogException::LogException(in_stack_fffffffffffff670,in_stack_fffffffffffff668);
    local_379 = 0;
    __cxa_throw(uVar5,&LogException::typeinfo,LogException::~LogException);
  }
  local_3ec = 0x6e;
  memset(local_3e8,0,0x6e);
  local_3e8[0].sa_family = 1;
  uVar5 = std::__cxx11::string::c_str();
  snprintf(local_3e8[0].sa_data,0x6c,"%s",uVar5);
  iVar1 = bind(*(int *)&in_RDI[0xe]._vptr_ILogger,local_3e8,local_3ec);
  if (iVar1 < 0) {
    std::__cxx11::stringstream::stringstream(local_578);
    poVar3 = std::operator<<(local_568,"Cannot bind to path: ");
    poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 10));
    poVar3 = std::operator<<(poVar3," error: ");
    piVar4 = __errno_location();
    pcVar2 = strerror(*piVar4);
    std::operator<<(poVar3,pcVar2);
    local_599 = 1;
    uVar5 = __cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    LogException::LogException(in_stack_fffffffffffff670,in_stack_fffffffffffff668);
    local_599 = 0;
    __cxa_throw(uVar5,&LogException::typeinfo,LogException::~LogException);
  }
  iVar1 = listen(*(int *)&in_RDI[0xe]._vptr_ILogger,0xf);
  if (iVar1 < 0) {
    std::__cxx11::stringstream::stringstream(local_728);
    poVar3 = std::operator<<(local_718,"Cannot listen on path: ");
    poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 10));
    poVar3 = std::operator<<(poVar3," error: ");
    piVar4 = __errno_location();
    pcVar2 = strerror(*piVar4);
    std::operator<<(poVar3,pcVar2);
    local_749 = 1;
    uVar5 = __cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    LogException::LogException(in_stack_fffffffffffff670,in_stack_fffffffffffff668);
    local_749 = 0;
    __cxa_throw(uVar5,&LogException::typeinfo,LogException::~LogException);
  }
  iVar1 = pthread_create((pthread_t *)(in_RDI + 1),(pthread_attr_t *)0x0,Run,in_RDI);
  if (iVar1 != 0) {
    std::__cxx11::stringstream::stringstream(local_8d8);
    this_00 = (LogException *)std::operator<<(local_8c8,"Cannot start thread: ");
    piVar4 = __errno_location();
    pcVar2 = strerror(*piVar4);
    std::operator<<((ostream *)this_00,pcVar2);
    message = (string *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    LogException::LogException(this_00,message);
    __cxa_throw(message,&LogException::typeinfo,LogException::~LogException);
  }
  *(undefined1 *)((long)&in_RDI[0xf]._vptr_ILogger + 4) = 1;
  return;
}

Assistant:

LogUnixServer::LogUnixServer(const std::string &path) :
	m_path(path),
	m_acceptfd(-1),
	m_running(false)
{
	m_ctlfd[0] = -1;
	m_ctlfd[1] = -1;

	try
	{
		if (pthread_mutex_init(&m_mutex, NULL) != 0)
			abort();

		unlink(m_path.c_str());
		m_acceptfd = socket(AF_UNIX, SOCK_STREAM, 0);
		if (m_acceptfd < 0)
		{
			std::stringstream ss;
			ss << "Cannot create socket: " << strerror(errno);
			throw(LogException(ss.str()));
		}

		if (socketpair(AF_LOCAL, SOCK_STREAM, 0, m_ctlfd) != 0)
		{
			std::stringstream ss;
			ss << "Cannot create ctlfd: " << strerror(errno);
			throw(LogException(ss.str()));
		}

		//Bind etc..
		struct sockaddr_un serv_addr;
		socklen_t sockaddr_len = sizeof(serv_addr);
		memset(&serv_addr, 0, sizeof(serv_addr));
		serv_addr.sun_family = AF_UNIX;
		snprintf(serv_addr.sun_path, sizeof(serv_addr.sun_path), "%s", m_path.c_str());

		if (bind(m_acceptfd, (struct sockaddr *) &serv_addr, sockaddr_len) < 0)
		{
			std::stringstream ss;
			ss << "Cannot bind to path: " << m_path << " error: " << strerror(errno);
			throw(LogException(ss.str()));
		}

		if (listen(m_acceptfd, 15) < 0)
		{
			std::stringstream ss;
			ss << "Cannot listen on path: " << m_path << " error: " << strerror(errno);
			throw(LogException(ss.str()));
		}

		//Create thread
		if (pthread_create(&m_thread, NULL, LogUnixServer::Run, this) != 0)
		{
			std::stringstream ss;
			ss << "Cannot start thread: " << strerror(errno);
			throw(LogException(ss.str()));
		}
		m_running = true;

	} catch(std::exception &ex)
	{
		if (m_acceptfd >= 0)
		{
			if (close(m_acceptfd) < 0)
			{
				abort();
			}
		}

		if (m_ctlfd[0] >= 0)
		{
			if (close(m_ctlfd[0]) < 0)
			{
				abort();
			}
		}

		if (m_ctlfd[1] >= 0)
		{
			if (close(m_ctlfd[1]) < 0)
			{
				abort();
			}
		}

		throw(ex);
	}
}